

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelmapped.h
# Opt level: O0

void __thiscall
TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>_>::TPZGeoElMapped
          (TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>_> *this,void **vtt)

{
  TPZGeoElRefPattern<pzgeom::TPZGeoTriangle> *in_RSI;
  double *in_RDI;
  int64_t unaff_retaddr;
  int64_t in_stack_00000008;
  TPZFNMatrix<6,_double> *in_stack_00000010;
  void **in_stack_ffffffffffffffe8;
  double *val;
  
  val = in_RDI;
  TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>::TPZGeoElRefPattern(in_RSI,in_stack_ffffffffffffffe8);
  *in_RDI = *(double *)&(in_RSI->super_TPZGeoElRefLess<pzgeom::TPZGeoTriangle>).super_TPZGeoEl;
  *(undefined8 *)((long)in_RDI + *(long *)((long)*in_RDI + -0x60)) =
       *(undefined8 *)
        &(in_RSI->super_TPZGeoElRefLess<pzgeom::TPZGeoTriangle>).super_TPZGeoEl.fNumInterfaces;
  TPZFNMatrix<6,_double>::TPZFNMatrix(in_stack_00000010,in_stack_00000008,unaff_retaddr,val);
  return;
}

Assistant:

TPZGeoElMapped() : TPZRegisterClassId(&TPZGeoElMapped::ClassId),
    TBase(), fCornerCo(Geo::Dimension,Geo::NNodes,0.)
	{
	}